

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool __thiscall xla::GraphCycles::InsertEdge(GraphCycles *this,int32_t x,int32_t y)

{
  Rep *r_00;
  bool bVar1;
  reference pvVar2;
  reference this_00;
  reference pvVar3;
  reference pvVar4;
  Node *ny;
  Node *nx;
  NodeIO *ny_io;
  NodeIO *nx_io;
  Rep *r;
  int32_t y_local;
  int32_t x_local;
  GraphCycles *this_local;
  
  if (x == y) {
    this_local._7_1_ = false;
  }
  else {
    r_00 = this->rep_;
    pvVar2 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&r_00->node_io_,(long)x);
    bVar1 = OrderedSet<int>::Insert(&pvVar2->out,y);
    if (bVar1) {
      this_00 = std::
                vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                ::operator[](&r_00->node_io_,(long)y);
      OrderedSet<int>::Insert(&this_00->in,x);
      pvVar3 = std::
               vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ::operator[](&r_00->nodes_,(long)x);
      pvVar4 = std::
               vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ::operator[](&r_00->nodes_,(long)y);
      if (pvVar4->rank < pvVar3->rank) {
        bVar1 = ForwardDFS(r_00,y,pvVar3->rank);
        if (bVar1) {
          BackwardDFS(r_00,x,pvVar4->rank);
          Reorder(r_00);
          this_local._7_1_ = true;
        }
        else {
          OrderedSet<int>::Erase(&pvVar2->out,y);
          OrderedSet<int>::Erase(&this_00->in,x);
          ClearVisitedBits(r_00,&r_00->deltaf_);
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GraphCycles::InsertEdge(int32_t x, int32_t y) {
  if (x == y) return false;
  Rep* r = rep_;
  NodeIO* nx_io = &r->node_io_[x];
  if (!nx_io->out.Insert(y)) {
    // Edge already exists.
    return true;
  }

  NodeIO* ny_io = &r->node_io_[y];
  ny_io->in.Insert(x);

  Node* nx = &r->nodes_[x];
  Node* ny = &r->nodes_[y];
  if (nx->rank <= ny->rank) {
    // New edge is consistent with existing rank assignment.
    return true;
  }

  // Current rank assignments are incompatible with the new edge.  Recompute.
  // We only need to consider nodes that fall in the range [ny->rank,nx->rank].
  if (!ForwardDFS(r, y, nx->rank)) {
    // Found a cycle.  Undo the insertion and tell caller.
    nx_io->out.Erase(y);
    ny_io->in.Erase(x);
    // Since we do not call Reorder() on this path, clear any visited
    // markers left by ForwardDFS.
    ClearVisitedBits(r, r->deltaf_);
    return false;
  }
  BackwardDFS(r, x, ny->rank);
  Reorder(r);
  return true;
}